

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Block * __thiscall soul::StructuralParser::parseStatementAsNewBlock(StructuralParser *this)

{
  bool bVar1;
  StructuralParser *pSVar2;
  Statement *s;
  undefined1 local_70 [8];
  ScopedScope scope;
  Context local_58;
  StructuralParser *local_40;
  Block *newBlock;
  pool_ptr<soul::AST::Function> local_28;
  char *local_20;
  StructuralParser *local_18;
  StructuralParser *this_local;
  
  local_20 = "{";
  local_18 = this;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)"{");
  if (bVar1) {
    pool_ptr<soul::AST::Function>::pool_ptr(&local_28);
    this_local = (StructuralParser *)parseBracedBlock(this,&local_28);
    pool_ptr<soul::AST::Function>::~pool_ptr(&local_28);
  }
  else {
    getContext(&local_58,this);
    scope.oldScope = (Scope *)0x0;
    pSVar2 = (StructuralParser *)
             allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>
                       (this,&local_58,&scope.oldScope);
    AST::Context::~Context(&local_58);
    local_40 = pSVar2;
    ScopedScope::ScopedScope
              ((ScopedScope *)local_70,this,(Scope *)&(pSVar2->super_SOULTokeniser).currentType);
    pSVar2 = local_40;
    s = parseStatement(this);
    AST::Block::addStatement((Block *)pSVar2,s);
    this_local = local_40;
    ScopedScope::~ScopedScope((ScopedScope *)local_70);
  }
  return (Block *)this_local;
}

Assistant:

AST::Block& parseStatementAsNewBlock()
    {
        if (matches (Operator::openBrace))
            return parseBracedBlock ({});

        auto& newBlock = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, newBlock);
        newBlock.addStatement (parseStatement());
        return newBlock;
    }